

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

object __thiscall
pybind11::detail::accessor_policies::tuple_item::get(tuple_item *this,handle obj,size_t index)

{
  long *plVar1;
  error_already_set *this_00;
  
  plVar1 = (long *)PyTuple_GetItem(obj.m_ptr,index);
  if (plVar1 != (long *)0x0) {
    *(long **)this = plVar1;
    *plVar1 = *plVar1 + 1;
    return (object)(handle)this;
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

static object get(handle obj, size_t index) {
        PyObject *result = PyTuple_GetItem(obj.ptr(), static_cast<ssize_t>(index));
        if (!result) { throw error_already_set(); }
        return {result, true};
    }